

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O2

void ipred_dc_uv(pel *src,pel *dst,int i_dst,int w,int h,u16 avail_cu,int bit_depth)

{
  int iVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  byte *pbVar5;
  short sVar6;
  int iVar8;
  ulong uVar9;
  bool bVar10;
  int iVar7;
  
  if ((avail_cu & 2) == 0) {
    if ((avail_cu & 1) == 0) {
      iVar7 = 1 << ((char)bit_depth - 1U & 0x1f);
      sVar6 = (short)iVar7;
      goto LAB_00116a89;
    }
    iVar7 = 0;
    iVar8 = 0;
    for (lVar3 = 0; lVar3 < w * 2; lVar3 = lVar3 + 2) {
      iVar8 = iVar8 + (uint)src[lVar3 + 2];
      iVar7 = iVar7 + (uint)src[lVar3 + 3];
    }
    iVar1 = w >> 1;
    iVar8 = iVar8 + iVar1;
    iVar2 = w;
  }
  else {
    pbVar5 = src + -1;
    iVar7 = 0;
    iVar8 = 0;
    for (lVar3 = 0; lVar3 < h * 2; lVar3 = lVar3 + 2) {
      iVar8 = iVar8 + (uint)pbVar5[-1];
      iVar7 = iVar7 + (uint)*pbVar5;
      pbVar5 = pbVar5 + -2;
    }
    if ((avail_cu & 1) != 0) {
      for (lVar3 = 0; lVar3 < w * 2; lVar3 = lVar3 + 2) {
        iVar8 = iVar8 + (uint)src[lVar3 + 2];
        iVar7 = iVar7 + (uint)src[lVar3 + 3];
      }
      iVar1 = h + w >> 1;
      iVar2 = (int)(0x1000 / (long)(h + w));
      sVar6 = (short)((iVar8 + iVar1) * iVar2 >> 0xc);
      iVar7 = (iVar7 + iVar1) * iVar2 >> 0xc;
      goto LAB_00116a89;
    }
    iVar1 = h >> 1;
    iVar8 = iVar8 + iVar1;
    iVar2 = h;
  }
  sVar6 = (short)(iVar8 >> (g_tbl_log2[iVar2] & 0x1fU));
  iVar7 = iVar7 + iVar1 >> (g_tbl_log2[iVar2] & 0x1fU);
LAB_00116a89:
  uVar9 = (ulong)(uint)w;
  if (w < 1) {
    uVar9 = 0;
  }
  while (bVar10 = h != 0, h = h + -1, bVar10) {
    for (uVar4 = 0; uVar9 != uVar4; uVar4 = uVar4 + 1) {
      *(short *)(dst + uVar4 * 2) = (short)(iVar7 << 8) + sVar6;
    }
    dst = dst + i_dst;
  }
  return;
}

Assistant:

void ipred_dc_uv(pel *src, pel *dst, int i_dst, int w, int h, u16 avail_cu, int bit_depth)
{
    uavs3d_assert(g_tbl_log2[w] >= 2);
    uavs3d_assert(g_tbl_log2[h] >= 2);

    int dc_u = 0, dc_v = 0;
    int i, j;
    int w2 = w << 1;
    int h2 = h << 1;

    if (IS_AVAIL(avail_cu, AVAIL_LE)) {
        for (i = 0; i < h2; i += 2) {
            dc_u += src[-i - 2];
            dc_v += src[-i - 1];
        }
        if (IS_AVAIL(avail_cu, AVAIL_UP)) {
            for (j = 0; j < w2; j += 2) {
                dc_u += src[j + 2];
                dc_v += src[j + 3];
            }
            dc_u = (dc_u + ((w + h) >> 1)) * (4096 / (w + h)) >> 12;
            dc_v = (dc_v + ((w + h) >> 1)) * (4096 / (w + h)) >> 12;
        } else {
            dc_u = (dc_u + (h >> 1)) >> g_tbl_log2[h];
            dc_v = (dc_v + (h >> 1)) >> g_tbl_log2[h];
        }
    } else if (IS_AVAIL(avail_cu, AVAIL_UP)) {
        for (j = 0; j < w2; j += 2) {
            dc_u += src[j + 2];
            dc_v += src[j + 3];
        }
        dc_u = (dc_u + (w >> 1)) >> g_tbl_log2[w];
        dc_v = (dc_v + (w >> 1)) >> g_tbl_log2[w];
    } else {
        dc_u = dc_v = 1 << (bit_depth - 1);
    }

    int shift = sizeof(pel) * 8;
    int uv_pixel = (dc_v << shift) + dc_u;

    while (h--) {
        com_mset_2pel(dst, uv_pixel, w);
        dst += i_dst;
    }
}